

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O0

int pstore::file::file_handle::lock_reg
              (int fd,int cmd,short type,off_t offset,short whence,off_t len)

{
  int iVar1;
  short local_50;
  short local_4e;
  flock lock;
  off_t len_local;
  short whence_local;
  off_t offset_local;
  short type_local;
  int cmd_local;
  int fd_local;
  
  lock._24_8_ = len;
  memset(&local_50,0,0x20);
  lock.l_start = lock._24_8_;
  lock.l_len._0_4_ = 0;
  local_50 = type;
  local_4e = whence;
  lock._0_8_ = offset;
  iVar1 = fcntl(fd,cmd,&local_50);
  return iVar1;
}

Assistant:

int file_handle::lock_reg (int const fd, int const cmd, short const type,
                                   off_t const offset, short const whence, off_t const len) {
            struct flock lock {};
            lock.l_type = type;     // type of lock: F_RDLCK, F_WRLCK, F_UNLCK
            lock.l_whence = whence; // how to interpret l_start (SEEK_SET/SEEK_CUR/SEEK_END)
            lock.l_start = offset;  // starting offset for lock
            lock.l_len = len;       // number of bytes to lock
            lock.l_pid = 0;         // PID of blocking process (set by F_GETLK and F_OFD_GETLK)
            return fcntl (fd, cmd, &lock); // NOLINT
        }